

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalExplain::Serialize(LogicalExplain *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WriteProperty<duckdb::ExplainType>
            (serializer,200,"explain_type",&(this->super_LogicalOperator).field_0x61);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"physical_plan",&this->physical_plan);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xca,"logical_plan_unopt",&this->logical_plan_unopt);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"logical_plan_opt",&this->logical_plan_opt);
  return;
}

Assistant:

void LogicalExplain::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty<ExplainType>(200, "explain_type", explain_type);
	serializer.WritePropertyWithDefault<string>(201, "physical_plan", physical_plan);
	serializer.WritePropertyWithDefault<string>(202, "logical_plan_unopt", logical_plan_unopt);
	serializer.WritePropertyWithDefault<string>(203, "logical_plan_opt", logical_plan_opt);
}